

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void matrix_print(gf *a,int m,int n)

{
  int col;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  if (m < 1) {
    m = 0;
  }
  for (uVar3 = 0; uVar3 != (uint)m; uVar3 = uVar3 + 1) {
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      fprintf(_stderr,"%-3u ",(ulong)a[uVar1]);
    }
    fputc(10,_stderr);
    a = a + n;
  }
  return;
}

Assistant:

void matrix_print(gf *a, int m, int n) {
  int row;
  for (row = 0; row < m; row++) {
    int col;
    for (col = 0; col < n; col++)
      fprintf(stderr, "%-3u ", a[row * n + col]);
    fprintf(stderr, "\n");
  }
}